

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDShift(TranslateToFuzzReader *this)

{
  SIMDShiftOp SVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  
  SVar1 = Random::
          pick<wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp,wasm::SIMDShiftOp>
                    (&this->random,ShlVecI8x16,ShrSVecI8x16,ShrUVecI8x16,ShlVecI16x8,ShrSVecI16x8,
                     ShrUVecI16x8,ShlVecI32x4,ShrSVecI32x4,ShrUVecI32x4,ShlVecI64x2,ShrSVecI64x2,
                     ShrUVecI64x2);
  pEVar2 = make(this,(Type)0x6);
  pEVar3 = make(this,(Type)0x2);
  pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  *(undefined8 *)pEVar4 = 0;
  (pEVar4->type).id = 0;
  *(undefined8 *)(pEVar4 + 1) = 0;
  pEVar4->_id = SIMDShiftId;
  *(SIMDShiftOp *)(pEVar4 + 1) = SVar1;
  pEVar4[1].type.id = (uintptr_t)pEVar2;
  *(Expression **)(pEVar4 + 2) = pEVar3;
  wasm::SIMDShift::finalize();
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDShift() {
  SIMDShiftOp op = pick(ShlVecI8x16,
                        ShrSVecI8x16,
                        ShrUVecI8x16,
                        ShlVecI16x8,
                        ShrSVecI16x8,
                        ShrUVecI16x8,
                        ShlVecI32x4,
                        ShrSVecI32x4,
                        ShrUVecI32x4,
                        ShlVecI64x2,
                        ShrSVecI64x2,
                        ShrUVecI64x2);
  Expression* vec = make(Type::v128);
  Expression* shift = make(Type::i32);
  return builder.makeSIMDShift(op, vec, shift);
}